

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trigonometric.hpp
# Opt level: O1

Vector4<mt::Dual<float>_> * __thiscall
mt::logLerpUnit<mt::Dual<float>,float>
          (Vector4<mt::Dual<float>_> *__return_storage_ptr__,mt *this,Vector4<mt::Dual<float>_> *u1,
          Vector4<mt::Dual<float>_> *u2,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ulong uVar13;
  Dual<float> DVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float local_11c;
  float local_d8;
  float fStack_d4;
  float local_98;
  float fStack_94;
  float local_78;
  float fStack_74;
  float local_20;
  float local_1c;
  
  local_78 = *(float *)this;
  fStack_74 = *(float *)(this + 8);
  uVar13 = CONCAT44(fStack_74,local_78);
  fVar8 = *(float *)(this + 0x10);
  fVar1 = *(float *)(this + 0x18);
  fVar15 = fVar8 * fVar8 + local_78 * local_78 + fStack_74 * fStack_74;
  local_11c = fVar8;
  if (fVar15 != 0.0) {
    auVar17 = rsqrtss(ZEXT416(0),ZEXT416((uint)fVar15));
    fVar22 = auVar17._0_4_;
    fVar15 = fVar22 * -0.5 * (fVar15 * fVar22 * fVar22 + -3.0);
    local_78 = local_78 * fVar15;
    fStack_74 = fStack_74 * fVar15;
    local_11c = fVar8 * fVar15;
  }
  fVar15 = 1.0;
  if (fVar1 <= 1.0) {
    fVar15 = fVar1;
  }
  fVar7 = acosf((float)(~-(uint)(fVar1 < -1.0) & (uint)fVar15 | -(uint)(fVar1 < -1.0) & 0xbf800000))
  ;
  fVar5 = *(float *)(this + 4);
  fVar15 = *(float *)(this + 0xc);
  fVar22 = *(float *)(this + 0x14);
  fVar24 = *(float *)(this + 0x1c);
  fVar8 = -fVar8;
  uVar13 = uVar13 ^ 0x8000000080000000;
  local_d8 = (float)uVar13;
  fStack_d4 = (float)(uVar13 >> 0x20);
  fVar23 = fVar22 * local_d8;
  fVar26 = fStack_d4 * fVar5;
  fVar18 = fVar15 * local_d8;
  fVar21 = local_d8 * fVar24;
  fVar27 = fStack_d4 * fVar22;
  fVar25 = fStack_d4 * fVar24;
  local_98 = (u1->x).mReal;
  fStack_94 = (u1->y).mReal;
  uVar13 = CONCAT44(fStack_94,local_98);
  fVar10 = (u1->z).mReal;
  fVar2 = (u1->w).mReal;
  fVar16 = fVar10 * fVar10 + local_98 * local_98 + fStack_94 * fStack_94;
  fVar12 = fVar10;
  if (fVar16 != 0.0) {
    auVar17 = rsqrtss(ZEXT416(0),ZEXT416((uint)fVar16));
    fVar12 = auVar17._0_4_;
    fVar12 = fVar12 * -0.5 * (fVar16 * fVar12 * fVar12 + -3.0);
    local_98 = local_98 * fVar12;
    fStack_94 = fStack_94 * fVar12;
    fVar12 = fVar10 * fVar12;
  }
  fVar16 = fVar2;
  if (1.0 <= fVar2) {
    fVar16 = 1.0;
  }
  fVar9 = acosf((float)(-(uint)(fVar2 < -1.0) & 0xbf800000 | ~-(uint)(fVar2 < -1.0) & (uint)fVar16))
  ;
  fVar6 = (u1->x).mDual;
  fVar16 = (u1->y).mDual;
  fVar3 = (u1->z).mDual;
  fVar4 = (u1->w).mDual;
  fVar10 = -fVar10;
  uVar13 = uVar13 ^ 0x8000000080000000;
  local_d8 = (float)uVar13;
  fStack_d4 = (float)(uVar13 >> 0x20);
  fVar11 = 1.0 - t;
  fVar7 = fVar7 * fVar11;
  fVar9 = fVar9 * t;
  fVar19 = local_98 * fVar9 + fVar7 * local_78;
  fVar20 = fStack_94 * fVar9 + fStack_74 * fVar7;
  fVar7 = fVar9 * fVar12 + fVar7 * local_11c;
  fVar12 = SQRT(fVar7 * fVar7 + fVar20 * fVar20 + fVar19 * fVar19);
  if (fVar12 == 0.0) {
    fVar19 = 0.0;
    fVar20 = 0.0;
    local_1c = 0.0;
    local_20 = 1.0;
  }
  else {
    sincosf(fVar12,&local_1c,&local_20);
    local_1c = local_1c / fVar12;
    fVar19 = fVar19 * local_1c;
    fVar20 = fVar20 * local_1c;
    local_1c = local_1c * fVar7;
  }
  fVar22 = ((fVar10 * fVar4 - fVar16 * local_d8) + fStack_d4 * fVar6 + fVar3 * fVar2) * t +
           ((fVar8 * fVar24 - fVar18) + fVar26 + fVar22 * fVar1) * fVar11;
  fVar24 = ((fVar16 * fVar2 - fVar10 * fVar6) + fVar3 * local_d8 + fStack_d4 * fVar4) * t +
           ((fVar15 * fVar1 - fVar8 * fVar5) + fVar23 + fVar25) * fVar11;
  fVar8 = ((fVar10 * fVar16 + fVar2 * fVar6 + local_d8 * fVar4) - fStack_d4 * fVar3) * t +
          ((fVar8 * fVar15 + fVar1 * fVar5 + fVar21) - fVar27) * fVar11;
  DVar14.mDual = (fVar20 * fVar8 + local_20 * fVar22) - fVar19 * fVar24;
  DVar14.mReal = local_1c;
  (__return_storage_ptr__->x).mReal = fVar19;
  (__return_storage_ptr__->x).mDual = (local_1c * fVar24 + local_20 * fVar8) - fVar20 * fVar22;
  (__return_storage_ptr__->y).mReal = fVar20;
  (__return_storage_ptr__->y).mDual = (local_20 * fVar24 - local_1c * fVar8) + fVar19 * fVar22;
  __return_storage_ptr__->z = DVar14;
  __return_storage_ptr__->w =
       (Dual<float>)
       (CONCAT44(fVar24 * fVar20 + fVar22 * local_1c + fVar8 * fVar19,local_20) ^ 0x8000000000000000
       );
  return __return_storage_ptr__;
}

Assistant:

Vector4<Scalar1> logLerpUnit(const Vector4<Scalar1>& u1, const Vector4<Scalar1>& u2, Scalar2 t)
    {
        return exp(lerp(logUnit(u1), logUnit(u2), t));  
    }